

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_interface.cpp
# Opt level: O0

mt32emu_return_code
mt32emu_identify_rom_file(mt32emu_rom_info *rom_info,char *filename,char *machine_id)

{
  FileStream *pFStack_30;
  mt32emu_return_code rc;
  FileStream *fs;
  char *machine_id_local;
  char *filename_local;
  mt32emu_rom_info *rom_info_local;
  
  fs = (FileStream *)machine_id;
  machine_id_local = filename;
  filename_local = (char *)rom_info;
  rom_info_local._4_4_ = MT32Emu::createFileStream(filename,&stack0xffffffffffffffd0);
  if ((pFStack_30 != (FileStream *)0x0) &&
     (rom_info_local._4_4_ =
           MT32Emu::identifyROM((mt32emu_rom_info *)filename_local,(File *)pFStack_30,(char *)fs),
     pFStack_30 != (FileStream *)0x0)) {
    (*(pFStack_30->super_AbstractFile).super_File._vptr_File[1])();
  }
  return rom_info_local._4_4_;
}

Assistant:

mt32emu_return_code MT32EMU_C_CALL mt32emu_identify_rom_file(mt32emu_rom_info *rom_info, const char *filename, const char *machine_id) {
	FileStream *fs;
	mt32emu_return_code rc = createFileStream(filename, fs);
	if (fs == NULL) return rc;
	rc = identifyROM(rom_info, fs, machine_id);
	delete fs;
	return rc;
}